

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkDfsIterNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots)

{
  ulong uVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  int *piVar4;
  Vec_Ptr_t *vNodes;
  void **ppvVar5;
  Vec_Ptr_t *vStack;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  Abc_Obj_t *pRoot;
  long lVar7;
  int iVar8;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar8 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar8) {
      piVar4 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar8;
    }
    if (-500 < iVar2) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar8;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 1000;
    vNodes->nSize = 0;
    ppvVar5 = (void **)malloc(8000);
    vNodes->pArray = ppvVar5;
    vStack = (Vec_Ptr_t *)malloc(0x10);
    vStack->nCap = 1000;
    vStack->nSize = 0;
    ppvVar5 = (void **)malloc(8000);
    vStack->pArray = ppvVar5;
    if (0 < vRoots->nSize) {
      lVar7 = 0;
      uVar6 = extraout_RDX;
      do {
        pRoot = (Abc_Obj_t *)((ulong)vRoots->pArray[lVar7] & 0xfffffffffffffffe);
        pAVar3 = pRoot->pNtk;
        iVar2 = pRoot->Id;
        Vec_IntFillExtra(&pAVar3->vTravIds,iVar2 + 1,(int)uVar6);
        if (((long)iVar2 < 0) || ((pAVar3->vTravIds).nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar6 = extraout_RDX_00;
        if ((pAVar3->vTravIds).pArray[iVar2] != pRoot->pNtk->nTravIds) {
          Abc_NtkDfs_iter(vStack,pRoot,vNodes);
          uVar6 = extraout_RDX_01;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < vRoots->nSize);
    }
    if (vStack->pArray != (void **)0x0) {
      free(vStack->pArray);
      vStack->pArray = (void **)0x0;
    }
    free(vStack);
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsIterNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots )
{
    Vec_Ptr_t * vNodes, * vStack;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 1000 );
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pObj)) )
            Abc_NtkDfs_iter( vStack, Abc_ObjRegular(pObj), vNodes );
    Vec_PtrFree( vStack );
    return vNodes;
}